

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9ICheck(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int *__ptr;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint nTimeOut;
  Vec_Int_t *pVVar4;
  char *pcVar5;
  char *pcVar6;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  
  nTimeOut = 0;
  Extra_UtilGetoptReset();
  local_50 = 1;
  local_4c = 0;
  bVar1 = true;
  local_48 = 0;
  local_44 = 0;
  local_40 = 0;
  local_54 = 0;
  do {
    while( true ) {
      while( true ) {
        while (iVar3 = Extra_UtilGetopt(argc,argv,"MTesrbdvh"), iVar2 = globalUtilOptind,
              100 < iVar3) {
          if (iVar3 < 0x73) {
            if (iVar3 == 0x65) {
              local_4c = local_4c ^ 1;
            }
            else {
              if (iVar3 != 0x72) goto LAB_002381bf;
              local_48 = local_48 ^ 1;
            }
          }
          else if (iVar3 == 0x73) {
            bVar1 = (bool)(bVar1 ^ 1);
          }
          else {
            if (iVar3 != 0x76) goto LAB_002381bf;
            local_54 = local_54 ^ 1;
          }
        }
        if (iVar3 < 0x62) break;
        if (iVar3 == 0x62) {
          local_44 = local_44 ^ 1;
        }
        else {
          if (iVar3 != 100) goto LAB_002381bf;
          local_40 = local_40 ^ 1;
        }
      }
      if (iVar3 == 0x4d) break;
      if (iVar3 != 0x54) {
        if (iVar3 == -1) {
          if (pAbc->pGia == (Gia_Man_t *)0x0) {
            pcVar5 = "Abc_CommandAbc9ICheck(): There is no AIG.\n";
          }
          else {
            if (pAbc->pGia->nRegs != 0) {
              if (pAbc->vIndFlops != (Vec_Int_t *)0x0) {
                __ptr = pAbc->vIndFlops->pArray;
                if (__ptr != (int *)0x0) {
                  free(__ptr);
                  pAbc->vIndFlops->pArray = (int *)0x0;
                }
                if (pAbc->vIndFlops != (Vec_Int_t *)0x0) {
                  free(pAbc->vIndFlops);
                  pAbc->vIndFlops = (Vec_Int_t *)0x0;
                }
              }
              if (bVar1) {
                pVVar4 = Bmc_PerformISearch(pAbc->pGia,local_50,nTimeOut,local_48,local_44,local_40,
                                            local_54);
                pAbc->vIndFlops = pVVar4;
              }
              else {
                Bmc_PerformICheck(pAbc->pGia,local_50,nTimeOut,local_4c,local_54);
              }
              if (pAbc->vIndFlops == (Vec_Int_t *)0x0) {
                local_50 = 0;
              }
              pAbc->nIndFrames = local_50;
              return 0;
            }
            pcVar5 = "Abc_CommandAbc9ICheck(): The AIG is combinational.\n";
          }
          Abc_Print(-1,pcVar5);
          return 0;
        }
        goto LAB_002381bf;
      }
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-T\" should be followed by an integer.\n";
LAB_002381b3:
        Abc_Print(-1,pcVar5);
        goto LAB_002381bf;
      }
      nTimeOut = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar2 + 1;
      if ((int)nTimeOut < 0) goto LAB_002381bf;
    }
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-M\" should be followed by an integer.\n";
      goto LAB_002381b3;
    }
    local_50 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
  } while (0 < (int)local_50);
LAB_002381bf:
  Abc_Print(-2,"usage: &icheck [-MT num] [-esrbdvh]\n");
  Abc_Print(-2,"\t         performs specialized induction check\n");
  Abc_Print(-2,"\t-M num : the number of timeframes used for induction [default = %d]\n",
            (ulong)local_50);
  Abc_Print(-2,"\t-T num : approximate global runtime limit in seconds [default = %d]\n",
            (ulong)nTimeOut);
  pcVar6 = "yes";
  pcVar5 = "yes";
  if (local_4c == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-e     : toggle using empty set of next-state functions [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (!bVar1) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-s     : toggle searching for a minimal subset [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (local_48 == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-r     : toggle searching in the reverse order [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (local_44 == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-b     : toggle searching in backward order from POs [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (local_40 == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle printing out the resulting set [default = %s]\n",pcVar5);
  if (local_54 == 0) {
    pcVar6 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9ICheck( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, nFramesMax = 1, nTimeOut = 0, fEmpty = 0, fSearch = 1, fReverse = 0, fBackTopo = 0, fDump = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MTesrbdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFramesMax <= 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut < 0 )
                goto usage;
            break;
        case 'e':
            fEmpty ^= 1;
            break;
        case 's':
            fSearch ^= 1;
            break;
        case 'r':
            fReverse ^= 1;
            break;
        case 'b':
            fBackTopo ^= 1;
            break;
        case 'd':
            fDump ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9ICheck(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9ICheck(): The AIG is combinational.\n" );
        return 0;
    }
    Vec_IntFreeP( &pAbc->vIndFlops );
    if ( fSearch )
        pAbc->vIndFlops = Bmc_PerformISearch( pAbc->pGia, nFramesMax, nTimeOut, fReverse, fBackTopo, fDump, fVerbose );
    else
        Bmc_PerformICheck( pAbc->pGia, nFramesMax, nTimeOut, fEmpty, fVerbose );
    pAbc->nIndFrames = pAbc->vIndFlops ? nFramesMax : 0;
    return 0;

usage:
    Abc_Print( -2, "usage: &icheck [-MT num] [-esrbdvh]\n" );
    Abc_Print( -2, "\t         performs specialized induction check\n" );
    Abc_Print( -2, "\t-M num : the number of timeframes used for induction [default = %d]\n",    nFramesMax );
    Abc_Print( -2, "\t-T num : approximate global runtime limit in seconds [default = %d]\n",    nTimeOut );
    Abc_Print( -2, "\t-e     : toggle using empty set of next-state functions [default = %s]\n", fEmpty? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle searching for a minimal subset [default = %s]\n",          fSearch? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle searching in the reverse order [default = %s]\n",          fReverse? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle searching in backward order from POs [default = %s]\n",    fBackTopo? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle printing out the resulting set [default = %s]\n",          fDump? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",            fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}